

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

AutoCloseFd __thiscall kj::anon_unknown_8::DiskFilesystem::openDir(DiskFilesystem *this,char *dir)

{
  int iVar1;
  int iVar2;
  AutoCloseFd extraout_RAX;
  Fault f;
  Fault local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  do {
    iVar1 = open(dir,0x90000);
    if (-1 < iVar1) goto LAB_0024e7a3;
    iVar2 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar2 == -1);
  if (iVar2 != 0) {
    local_30.exception = (Exception *)0x0;
    local_28 = 0;
    uStack_20 = 0;
    kj::_::Debug::Fault::init
              (&local_30,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
              );
    kj::_::Debug::Fault::fatal(&local_30);
  }
LAB_0024e7a3:
  *(int *)&(this->super_Filesystem)._vptr_Filesystem = iVar1;
  UnwindDetector::UnwindDetector
            ((UnwindDetector *)((long)&(this->super_Filesystem)._vptr_Filesystem + 4));
  return extraout_RAX;
}

Assistant:

static AutoCloseFd openDir(const char* dir) {
    int newFd;
    KJ_SYSCALL(newFd = open(dir, O_RDONLY | MAYBE_O_CLOEXEC | MAYBE_O_DIRECTORY));
    AutoCloseFd result(newFd);
#ifndef O_CLOEXEC
    setCloexec(result);
#endif
    return result;
  }